

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * __thiscall CMU462::Matrix4x4::operator-(Matrix4x4 *this,Matrix4x4 *B)

{
  double *pdVar1;
  Matrix4x4 *in_RDI;
  int j;
  int i;
  Matrix4x4 *A;
  Matrix4x4 *C;
  double in_stack_ffffffffffffffb8;
  Matrix4x4 *in_stack_ffffffffffffffc0;
  undefined4 local_28;
  undefined4 local_24;
  
  Matrix4x4(in_RDI);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      pdVar1 = operator()(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffb8,0));
      in_stack_ffffffffffffffb8 = *pdVar1;
      pdVar1 = operator()(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffb8,0));
      in_stack_ffffffffffffffc0 = (Matrix4x4 *)(in_stack_ffffffffffffffb8 - *pdVar1);
      pdVar1 = operator()(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffb8,0));
      *pdVar1 = (double)in_stack_ffffffffffffffc0;
    }
  }
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::operator-( const Matrix4x4& B ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 C;

    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       C(i,j) = A(i,j) - B(i,j);
    }

    return C;
  }